

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void adjust_inter_to_priority_list
               (Am_Object *inter,Am_Object *owner,Am_Object *owner_window,bool setting_main_priority
               ,bool multiowner,float main_priority,int second_priority,int third_priority)

{
  Am_Object *pAVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Ptr pvVar4;
  Am_Priority_List *pAVar5;
  Am_Wrapper *pAVar6;
  Am_Object local_98;
  Am_Object local_90;
  Am_Value_Type local_82;
  Am_Value_Type typ;
  Am_Object local_78;
  Am_Object local_70;
  undefined1 local_68 [8];
  Am_Value value;
  Am_Object on_window;
  Am_Priority_List *inter_list;
  Am_Object local_38;
  int local_2c;
  float local_28;
  int second_priority_local;
  float main_priority_local;
  bool multiowner_local;
  bool setting_main_priority_local;
  Am_Object *owner_window_local;
  Am_Object *owner_local;
  Am_Object *inter_local;
  
  local_2c = second_priority;
  local_28 = main_priority;
  second_priority_local._2_1_ = multiowner;
  second_priority_local._3_1_ = setting_main_priority;
  _main_priority_local = owner_window;
  owner_window_local = owner;
  owner_local = inter;
  pAVar3 = Am_Object::Get(inter,0x68,4);
  Am_Object::Am_Object(&local_38,pAVar3);
  bVar2 = Am_Object::Valid(&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar1 = owner_local;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(_main_priority_local);
    Am_Object::Set(pAVar1,0x68,pAVar6,0);
  }
  Am_Object::Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_68);
  pAVar3 = Am_Object::Peek(owner_local,0x129,4);
  Am_Value::operator=((Am_Value *)local_68,pAVar3);
  if (local_68._0_2_ == 0xa001) {
    Am_Object::operator=((Am_Object *)&value.value,(Am_Value *)local_68);
  }
  if ((((second_priority_local._2_1_ & 1) == 0) &&
      (bVar2 = Am_Object::Valid((Am_Object *)&value.value), bVar2)) &&
     (bVar2 = Am_Object::operator==((Am_Object *)&value.value,_main_priority_local), bVar2)) {
    pAVar3 = Am_Object::Get((Am_Object *)&value.value,0x124,4);
    pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
    pAVar5 = Am_Priority_List::Narrow(pvVar4);
    if ((second_priority_local._3_1_ & 1) == 0) {
      Am_Object::Am_Object(&local_78,owner_local);
      Am_Priority_List::Change_Second_Third_Priority(pAVar5,&local_78,local_2c,third_priority);
      Am_Object::~Am_Object(&local_78);
    }
    else {
      Am_Object::Am_Object(&local_70,owner_local);
      Am_Priority_List::Change_Main_Priority(pAVar5,&local_70,local_28);
      Am_Object::~Am_Object(&local_70);
    }
  }
  else {
    bVar2 = Am_Object::Valid((Am_Object *)&value.value);
    if (bVar2) {
      pAVar3 = Am_Object::Get((Am_Object *)&value.value,0x124,4);
      pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
      pAVar5 = Am_Priority_List::Narrow(pvVar4);
      if (pAVar5 != (Am_Priority_List *)0x0) {
        Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff80,owner_local);
        Am_Priority_List::Delete(pAVar5,(Am_Object *)&stack0xffffffffffffff80);
        Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff80);
      }
    }
    if (((second_priority_local._2_1_ & 1) == 0) &&
       (bVar2 = Am_Object::Valid(_main_priority_local), bVar2)) {
      if ((second_priority_local._3_1_ & 1) == 0) {
        pAVar3 = Am_Object::Get(owner_local,0xcd,4);
        local_28 = Am_Value::operator_cast_to_float(pAVar3);
      }
      else {
        local_82 = Am_Object::Get_Slot_Type(owner_window_local,0x86,0);
        if (local_82 == 2) {
          pAVar3 = Am_Object::Get(owner_window_local,0x86,4);
          local_2c = Am_Value::operator_cast_to_int(pAVar3);
        }
        local_82 = Am_Object::Get_Slot_Type(owner_window_local,0x85,0);
        if (local_82 == 2) {
          pAVar3 = Am_Object::Get(owner_window_local,0x85,4);
          third_priority = Am_Value::operator_cast_to_int(pAVar3);
        }
      }
      if ((local_2c == -1) || (third_priority == -1)) {
        Am_Object::Set(owner_local,0x129,0,1);
      }
      else {
        Am_Object::Am_Object(&local_90,owner_local);
        Am_Object::Am_Object(&local_98,_main_priority_local);
        add_priority_list_for_window
                  (&local_90,&local_98,local_28,local_2c,third_priority,false,false);
        Am_Object::~Am_Object(&local_98);
        Am_Object::~Am_Object(&local_90);
        pAVar1 = owner_local;
        pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(_main_priority_local);
        Am_Object::Set(pAVar1,0x129,pAVar6,1);
      }
    }
    else {
      Am_Object::Set(owner_local,0x129,0,1);
    }
  }
  Am_Value::~Am_Value((Am_Value *)local_68);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  return;
}

Assistant:

void
adjust_inter_to_priority_list(Am_Object &inter, Am_Object &owner,
                              Am_Object &owner_window,
                              bool setting_main_priority, bool multiowner,
                              float main_priority, int second_priority = -1,
                              int third_priority = -1)
{
  //if window slot not set yet, set it
  if (!Am_Object(inter.Get(Am_WINDOW, Am_NO_DEPENDENCY)).Valid())
    inter.Set(Am_WINDOW, owner_window);
  Am_Priority_List *inter_list;
  Am_Object on_window;
  Am_Value value;
  value = inter.Peek(Am_LAST_WINDOW, Am_NO_DEPENDENCY);
  if (value.type == Am_OBJECT)
    on_window = value;

  //std::cout << "......For inter " << inter << " Multiowner " << multiowner
  //      << " old win " << on_window << " new win " << owner_window
  //      <<std::endl <<std::flush;
  if (!multiowner && on_window.Valid() && on_window == owner_window) {
    // then just change priority in place
    inter_list = Am_Priority_List::Narrow(
        on_window.Get(Am_INTER_LIST, Am_NO_DEPENDENCY));
    if (setting_main_priority) {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Changing main priority of "
                               << inter << " to be " << main_priority << " in "
                               << on_window);
      inter_list->Change_Main_Priority(inter, main_priority);
    } else {
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Changing second/third priority of "
                               << inter << " to be (" << second_priority << ","
                               << third_priority << ") in " << on_window);
      inter_list->Change_Second_Third_Priority(inter, second_priority,
                                               third_priority);
    }
  } else { // don't have an old window or new window is different
    if (on_window.Valid()) {
      // then changing windows, remove from old window
      Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                           "Removing inter " << inter << " from window "
                                             << on_window);
      inter_list = Am_Priority_List::Narrow(
          on_window.Get(Am_INTER_LIST, Am_NO_DEPENDENCY));
      //std::cout << " ~~~Deleting from inter_list " << inter_list <<std::endl;
      if (inter_list)
        inter_list->Delete(inter); // removes inter if there
    }
    if (!multiowner && owner_window.Valid()) { // then add to new list
      Am_Value_Type typ;
      // second_priority is the Am_OWNER_DEPTH of the graphical object
      // (owner) of the interactor, computed by Opal and third is the Am_RANK
      if (setting_main_priority) {
        // then second and third parameters are bogus, have to Get them
        typ = owner.Get_Slot_Type(Am_OWNER_DEPTH);
        if (typ == Am_INT)
          second_priority = owner.Get(Am_OWNER_DEPTH, Am_NO_DEPENDENCY);
        typ = owner.Get_Slot_Type(Am_RANK);
        if (typ == Am_INT)
          third_priority = owner.Get(Am_RANK, Am_NO_DEPENDENCY);
      } else // need to get main_priority
        main_priority = inter.Get(Am_PRIORITY, Am_NO_DEPENDENCY);
      if (second_priority != -1 && third_priority != -1) {
        add_priority_list_for_window(inter, owner_window, main_priority,
                                     second_priority, third_priority, false,
                                     false);
        inter.Set(Am_LAST_WINDOW, owner_window, Am_OK_IF_NOT_THERE);
      } else
        inter.Set(Am_LAST_WINDOW, 0, Am_OK_IF_NOT_THERE);
    } else
      inter.Set(Am_LAST_WINDOW, 0, Am_OK_IF_NOT_THERE);
  }
}